

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O3

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
::Run(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
      *this)

{
  int iVar1;
  
  (*this->_vptr_BasicPLApproximator[0xf])();
  iVar1 = (*this->_vptr_BasicPLApproximator[0x10])(this,&this->laPrm_->plPoints);
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->_vptr_BasicPLApproximator[0x11])(this);
    if ((char)iVar1 == '\0') {
      (*this->_vptr_BasicPLApproximator[0x12])(this);
    }
    (*this->_vptr_BasicPLApproximator[0x13])(this);
    do {
      (*this->_vptr_BasicPLApproximator[0x15])(this);
      iVar1 = (*this->_vptr_BasicPLApproximator[0x14])(this);
    } while ((char)iVar1 != '\0');
    (*this->_vptr_BasicPLApproximator[0x16])(this);
    (*this->_vptr_BasicPLApproximator[0x17])(this);
    return;
  }
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::Run() {
   ClipFuncGraphDomain();
   if (CheckDomainReturnFalseIfTrivial(GetPL())) {
     if (!InitPeriodic())
       InitNonPeriodic();
     InitSubintervalLoop();
     do {
       ApproximateSubinterval();
     } while (NextSubinterval());
     ClipGraphFinal();
     ConsiderIntegrality();
   }
 }